

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O2

StringPtr *
kj::_::
CopyConstructArray_<kj::HashMap<kj::String,_int>::Entry,_kj::HashMap<kj::String,_int>::Entry_*,_true,_false>
::apply(StringPtr *pos,StringPtr *start,StringPtr *end)

{
  for (; start != end; start = start + 2) {
    HashMap<kj::String,_int>::Entry::Entry(pos,start);
    pos = pos + 2;
  }
  return pos;
}

Assistant:

static T* apply(T* __restrict__ pos, Iterator start, Iterator end) {
    // Verify that T can be *implicitly* constructed from the source values.
    if (false) implicitCast<T>(kj::mv(*start));

    if (noexcept(T(kj::mv(*start)))) {
      while (start != end) {
        ctor(*pos++, kj::mv(*start++));
      }
      return pos;
    } else {
      // Crap.  This is complicated.
      ExceptionGuard guard(pos);
      while (start != end) {
        ctor(*guard.pos, kj::mv(*start++));
        ++guard.pos;
      }
      guard.start = guard.pos;
      return guard.pos;
    }
  }